

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O3

uint64_t highwayhash::(anonymous_namespace)::RunHighway<2u>(void *param_1,size_t size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  V128<unsigned_long> t_1;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar9;
  ulong uVar8;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  V128<unsigned_long> t;
  undefined1 auVar13 [16];
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined4 uVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  char in [1024];
  HHStateSSE41 local_488;
  long local_408 [128];
  
  local_408[0]._0_1_ = (char)size;
  local_488.v0L.v_ = _DAT_001133b0;
  local_488.v0H.v_ = _DAT_001133c0;
  local_488.v1L.v_[0] = 0x3bd39e10cb0ef593;
  local_488.v1L.v_[1] = -0x3f530e974a0e7574;
  local_488.v1H.v_[0] = -0x41ab9932cb16f394;
  local_488.v1H.v_[1] = 0x452821e538d01377;
  local_488.mul0L.v_[0] = 0xdbe6d5d5fe4cce2f;
  local_488.mul0L.v_[1] = 0xa4093822299f31d0;
  local_488.mul0H.v_[0] = 0x13198a2e03707344;
  local_488.mul0H.v_[1] = 0x243f6a8885a308d3;
  local_488.mul1L.v_[0] = 0x3bd39e10cb0ef593;
  local_488.mul1L.v_[1] = 0xc0acf169b5f18a8c;
  local_488.mul1H.v_[0] = 0xbe5466cf34e90c6c;
  local_488.mul1H.v_[1] = 0x452821e638d01377;
  uVar5 = (ulong)((uint)size & 0x1f);
  uVar3 = size & 0xffffffffffffffe0;
  if (uVar3 != 0) {
    local_488.v1L.v_[0] = 0x3bd39e10cb0ef593;
    local_488.v1L.v_[1] = -0x3f530e974a0e7574;
    local_488.v1H.v_[0] = -0x41ab9932cb16f394;
    local_488.v1H.v_[1] = 0x452821e538d01377;
    local_488.mul0L.v_[0] = 0xdbe6d5d5fe4cce2f;
    local_488.mul0L.v_[1] = 0xa4093822299f31d0;
    local_488.mul0H.v_[0] = 0x13198a2e03707344;
    local_488.mul0H.v_[1] = 0x243f6a8885a308d3;
    local_488.mul1L.v_[0] = 0x3bd39e10cb0ef593;
    local_488.mul1L.v_[1] = 0xc0acf169b5f18a8c;
    local_488.mul1H.v_[0] = 0xbe5466cf34e90c6c;
    local_488.mul1H.v_[1] = 0x452821e638d01377;
    uVar2 = 0;
    do {
      auVar16._0_8_ =
           local_488.v1L.v_[0] + local_488.mul0L.v_[0] + *(long *)((long)local_408 + uVar2);
      auVar16._8_8_ =
           local_488.v1L.v_[1] + local_488.mul0L.v_[1] + *(long *)((long)local_408 + uVar2 + 8);
      auVar13._0_8_ =
           local_488.v1H.v_[0] + local_488.mul0H.v_[0] + *(long *)((long)local_408 + uVar2 + 0x10);
      auVar13._8_8_ =
           local_488.v1H.v_[1] + local_488.mul0H.v_[1] + *(long *)((long)local_408 + uVar2 + 0x18);
      uVar9 = local_488.v0L.v_[0]._4_4_;
      auVar6._4_4_ = uVar9;
      auVar6._0_4_ = uVar9;
      auVar6._8_4_ = local_488.v0L.v_[1]._4_4_;
      auVar6._12_4_ = local_488.v0L.v_[1]._4_4_;
      local_488.mul0L.v_[0] = (ulong)uVar9 * (auVar16._0_8_ & 0xffffffff) ^ local_488.mul0L.v_[0];
      local_488.mul0L.v_[1] =
           (auVar6._8_8_ & 0xffffffff) * (auVar16._8_8_ & 0xffffffff) ^ local_488.mul0L.v_[1];
      local_488.mul0H.v_[0] =
           (local_488.v0H.v_[0] >> 0x20) * (auVar13._0_8_ & 0xffffffff) ^ local_488.mul0H.v_[0];
      local_488.mul0H.v_[1] =
           (local_488.v0H.v_[1] >> 0x20) * (auVar13._8_8_ & 0xffffffff) ^ local_488.mul0H.v_[1];
      uVar14 = local_488.v0L.v_[0] + local_488.mul1L.v_[0];
      uVar15 = local_488.v0L.v_[1] + local_488.mul1L.v_[1];
      uVar8 = local_488.v0H.v_[0] + local_488.mul1H.v_[0];
      uVar10 = local_488.v0H.v_[1] + local_488.mul1H.v_[1];
      uVar9 = (uint)(auVar16._0_8_ >> 0x20);
      uVar18 = (undefined4)(auVar16._8_8_ >> 0x20);
      auVar11._4_4_ = uVar9;
      auVar11._0_4_ = uVar9;
      auVar11._8_4_ = uVar18;
      auVar11._12_4_ = uVar18;
      local_488.mul1L.v_[0] = (ulong)uVar9 * (uVar14 & 0xffffffff) ^ local_488.mul1L.v_[0];
      local_488.mul1L.v_[1] =
           (auVar11._8_8_ & 0xffffffff) * (uVar15 & 0xffffffff) ^ local_488.mul1L.v_[1];
      auVar6 = pshufb(auVar13,_DAT_00113230);
      local_488.v0H.v_[0] = auVar6._0_8_ + uVar8;
      local_488.v0H.v_[1] = auVar6._8_8_ + uVar10;
      auVar6 = pshufb((undefined1  [16])local_488.v0H.v_,_DAT_00113230);
      local_488.v1H.v_[0] = auVar6._0_8_ + auVar13._0_8_;
      local_488.v1H.v_[1] = auVar6._8_8_ + auVar13._8_8_;
      local_488.mul1H.v_[0] = (auVar13._0_8_ >> 0x20) * (uVar8 & 0xffffffff) ^ local_488.mul1H.v_[0]
      ;
      local_488.mul1H.v_[1] =
           (auVar13._8_8_ >> 0x20) * (uVar10 & 0xffffffff) ^ local_488.mul1H.v_[1];
      auVar6 = pshufb(auVar16,_DAT_00113230);
      local_488.v0L.v_[0] = auVar6._0_8_ + uVar14;
      local_488.v0L.v_[1] = auVar6._8_8_ + uVar15;
      auVar6 = pshufb((undefined1  [16])local_488.v0L.v_,_DAT_00113230);
      local_488.v1L.v_[0] = auVar6._0_8_ + auVar16._0_8_;
      local_488.v1L.v_[1] = auVar6._8_8_ + auVar16._8_8_;
      uVar2 = uVar2 + 0x20;
    } while (uVar2 < uVar3);
  }
  if (uVar5 != 0) {
    SSE41::HHStateSSE41::UpdateRemainder(&local_488,(char *)((long)local_408 + uVar3),uVar5);
  }
  iVar1 = 4;
  do {
    auVar4._0_8_ = CONCAT44((int)local_488.v0L.v_[0],local_488.v0L.v_[0]._4_4_);
    auVar4._8_4_ = local_488.v0L.v_[1]._4_4_;
    auVar4._12_4_ = (int)local_488.v0L.v_[1];
    auVar19._0_8_ = CONCAT44((int)local_488.v0H.v_[0],local_488.v0H.v_[0]._4_4_);
    auVar19._8_4_ = local_488.v0H.v_[1]._4_4_;
    auVar19._12_4_ = (int)local_488.v0H.v_[1];
    auVar17._0_8_ = local_488.v1L.v_[0] + local_488.mul0L.v_[0] + auVar19._0_8_;
    auVar17._8_8_ = local_488.v1L.v_[1] + local_488.mul0L.v_[1] + auVar19._8_8_;
    auVar7._0_8_ = local_488.v1H.v_[0] + local_488.mul0H.v_[0] + auVar4._0_8_;
    auVar7._8_8_ = local_488.v1H.v_[1] + local_488.mul0H.v_[1] + auVar4._8_8_;
    local_488.mul0L.v_[0] =
         (ulong)local_488.v0L.v_[0]._4_4_ * (auVar17._0_8_ & 0xffffffff) ^ local_488.mul0L.v_[0];
    local_488.mul0L.v_[1] =
         (auVar4._8_8_ & 0xffffffff) * (auVar17._8_8_ & 0xffffffff) ^ local_488.mul0L.v_[1];
    uVar2 = local_488.mul1H.v_[0] + local_488.v0H.v_[0];
    uVar8 = local_488.mul1H.v_[1] + local_488.v0H.v_[1];
    local_488.mul0H.v_[0] =
         local_488.mul0H.v_[0] ^ (local_488.v0H.v_[0] >> 0x20) * (auVar7._0_8_ & 0xffffffff);
    local_488.mul0H.v_[1] =
         local_488.mul0H.v_[1] ^ (local_488.v0H.v_[1] >> 0x20) * (auVar7._8_8_ & 0xffffffff);
    uVar5 = local_488.v0L.v_[0] + local_488.mul1L.v_[0];
    uVar3 = local_488.v0L.v_[1] + local_488.mul1L.v_[1];
    uVar9 = (uint)(auVar17._0_8_ >> 0x20);
    uVar18 = (undefined4)(auVar17._8_8_ >> 0x20);
    auVar12._4_4_ = uVar9;
    auVar12._0_4_ = uVar9;
    auVar12._8_4_ = uVar18;
    auVar12._12_4_ = uVar18;
    local_488.mul1L.v_[0] = (ulong)uVar9 * (uVar5 & 0xffffffff) ^ local_488.mul1L.v_[0];
    local_488.mul1L.v_[1] =
         (auVar12._8_8_ & 0xffffffff) * (uVar3 & 0xffffffff) ^ local_488.mul1L.v_[1];
    local_488.mul1H.v_[0] = local_488.mul1H.v_[0] ^ (auVar7._0_8_ >> 0x20) * (uVar2 & 0xffffffff);
    local_488.mul1H.v_[1] = local_488.mul1H.v_[1] ^ (auVar7._8_8_ >> 0x20) * (uVar8 & 0xffffffff);
    auVar6 = pshufb(auVar17,_DAT_00113230);
    local_488.v0L.v_[0] = auVar6._0_8_ + uVar5;
    local_488.v0L.v_[1] = auVar6._8_8_ + uVar3;
    auVar6 = pshufb(auVar7,_DAT_00113230);
    local_488.v0H.v_[0] = auVar6._0_8_ + uVar2;
    local_488.v0H.v_[1] = auVar6._8_8_ + uVar8;
    auVar6 = pshufb((undefined1  [16])local_488.v0L.v_,_DAT_00113230);
    local_488.v1L.v_[0] = auVar6._0_8_ + auVar17._0_8_;
    local_488.v1L.v_[1] = auVar6._8_8_ + auVar17._8_8_;
    auVar6 = pshufb((undefined1  [16])local_488.v0H.v_,_DAT_00113230);
    local_488.v1H.v_[0] = auVar7._0_8_ + auVar6._0_8_;
    local_488.v1H.v_[1] = auVar7._8_8_ + auVar6._8_8_;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return local_488.v0L.v_[0] + local_488.mul1L.v_[0] + local_488.mul0L.v_[0] + local_488.v1L.v_[0];
}

Assistant:

uint64_t RunHighway(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  HHResult64 result;
  HHStateT<Target> state(key);
  HighwayHashT(&state, in, size, &result);
  return result;
}